

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O1

void __thiscall
spvtools::opt::analysis::DefUseManager::ClearInst(DefUseManager *this,Instruction *inst)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  uint32_t uVar3;
  const_iterator __first;
  const_iterator __last;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  __hash_code __code;
  
  uVar1 = (this->inst_to_used_ids_)._M_h._M_bucket_count;
  uVar4 = (ulong)inst % uVar1;
  p_Var5 = (this->inst_to_used_ids_)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, (Instruction *)p_Var5->_M_nxt[1]._M_nxt != inst)) {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, (Instruction *)p_Var2[1]._M_nxt == inst)) goto LAB_0059f27f;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_0059f27f:
  if ((((p_Var6 != (__node_base_ptr)0x0) && (p_Var6->_M_nxt != (_Hash_node_base *)0x0)) &&
      (EraseUseRecordsOfOperandIds(this,inst), inst->has_result_id_ == true)) &&
     (uVar3 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_), uVar3 != 0)) {
    __first = UsersBegin(this,inst);
    for (__last._M_node = __first._M_node;
        ((_Rb_tree_header *)__last._M_node !=
         &(this->id_to_users_)._M_t._M_impl.super__Rb_tree_header &&
        (*(Instruction **)(__last._M_node + 1) == inst));
        __last._M_node = (_Base_ptr)std::_Rb_tree_increment(__last._M_node)) {
    }
    std::
    _Rb_tree<spvtools::opt::analysis::UserEntry,_spvtools::opt::analysis::UserEntry,_std::_Identity<spvtools::opt::analysis::UserEntry>,_spvtools::opt::analysis::UserEntryLess,_std::allocator<spvtools::opt::analysis::UserEntry>_>
    ::_M_erase_aux(&(this->id_to_users_)._M_t,(const_iterator)__first._M_node,__last);
    if (inst->has_result_id_ == true) {
      Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
    }
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)this);
  }
  return;
}

Assistant:

void DefUseManager::ClearInst(Instruction* inst) {
  auto iter = inst_to_used_ids_.find(inst);
  if (iter != inst_to_used_ids_.end()) {
    EraseUseRecordsOfOperandIds(inst);
    if (inst->result_id() != 0) {
      // Remove all uses of this inst.
      auto users_begin = UsersBegin(inst);
      auto end = id_to_users_.end();
      auto new_end = users_begin;
      for (; UsersNotEnd(new_end, end, inst); ++new_end) {
      }
      id_to_users_.erase(users_begin, new_end);
      id_to_def_.erase(inst->result_id());
    }
  }
}